

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong size_00;
  uchar *out_00;
  size_t sVar4;
  char **ppcStack_160;
  uint alread_added_id_text;
  size_t i;
  size_t size;
  uchar *converted;
  size_t datasize;
  uchar *data;
  ucvector outv;
  LodePNGInfo info;
  LodePNGState *state_local;
  uint h_local;
  uint w_local;
  uchar *image_local;
  size_t *outsize_local;
  uchar **out_local;
  
  datasize = 0;
  converted = (uchar *)0x0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  info.unknown_chunks_size[2] = (size_t)state;
  lodepng_info_init((LodePNGInfo *)&outv.allocsize);
  lodepng_info_copy((LodePNGInfo *)&outv.allocsize,
                    (LodePNGInfo *)(info.unknown_chunks_size[2] + 0xb8));
  if (((info.interlace_method == 3) || (*(int *)(info.unknown_chunks_size[2] + 0x80) != 0)) &&
     ((info.color.palette == (uchar *)0x0 || ((uchar *)0x100 < info.color.palette)))) {
    *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x44;
    return *(uint *)(info.unknown_chunks_size[2] + 0x1a0);
  }
  if (*(int *)(info.unknown_chunks_size[2] + 0x68) != 0) {
    uVar2 = lodepng_auto_choose_color
                      ((LodePNGColorMode *)&info.interlace_method,image,w,h,
                       (LodePNGColorMode *)(info.unknown_chunks_size[2] + 0x90));
    *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
  }
  if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) {
    return *(uint *)(info.unknown_chunks_size[2] + 0x1a0);
  }
  if (2 < *(uint *)(info.unknown_chunks_size[2] + 0x38)) {
    *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x3d;
    return 0x3d;
  }
  if (1 < *(uint *)(info.unknown_chunks_size[2] + 0xc0)) {
    *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x47;
    return 0x47;
  }
  uVar2 = checkColorValidity(info.interlace_method,info._12_4_);
  *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
  if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) {
    return *(uint *)(info.unknown_chunks_size[2] + 0x1a0);
  }
  uVar2 = checkColorValidity(*(LodePNGColorType *)(info.unknown_chunks_size[2] + 0x90),
                             *(uint *)(info.unknown_chunks_size[2] + 0x94));
  *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
  if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) {
    return *(uint *)(info.unknown_chunks_size[2] + 0x1a0);
  }
  iVar3 = lodepng_color_mode_equal
                    ((LodePNGColorMode *)(info.unknown_chunks_size[2] + 0x90),
                     (LodePNGColorMode *)&info.interlace_method);
  if (iVar3 == 0) {
    uVar2 = lodepng_get_bpp((LodePNGColorMode *)&info.interlace_method);
    size_00 = (ulong)(w * h * uVar2 + 7 >> 3);
    out_00 = (uchar *)lodepng_malloc(size_00);
    if ((out_00 == (uchar *)0x0) && (size_00 != 0)) {
      *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x53;
    }
    if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) == 0) {
      uVar2 = lodepng_convert(out_00,image,(LodePNGColorMode *)&info.interlace_method,
                              (LodePNGColorMode *)(info.unknown_chunks_size[2] + 0x90),w,h);
      *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
    }
    if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) == 0) {
      preProcessScanlines((uchar **)&datasize,(size_t *)&converted,out_00,w,h,
                          (LodePNGInfo *)&outv.allocsize,
                          (LodePNGEncoderSettings *)(info.unknown_chunks_size[2] + 0x38));
    }
    lodepng_free(out_00);
  }
  else {
    preProcessScanlines((uchar **)&datasize,(size_t *)&converted,image,w,h,
                        (LodePNGInfo *)&outv.allocsize,
                        (LodePNGEncoderSettings *)(info.unknown_chunks_size[2] + 0x38));
  }
  ucvector_init((ucvector *)&data);
  if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) == 0) {
    writeSignature((ucvector *)&data);
    addChunk_IHDR((ucvector *)&data,w,h,info.interlace_method,info._12_4_,info.compression_method);
    if (info._176_8_ != 0) {
      uVar2 = addUnknownChunks((ucvector *)&data,(uchar *)info._176_8_,
                               (size_t)info.unknown_chunks_data[2]);
      *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
      if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) goto LAB_002895f0;
    }
    if (info.interlace_method == 3) {
      addChunk_PLTE((ucvector *)&data,(LodePNGColorMode *)&info.interlace_method);
    }
    if ((*(int *)(info.unknown_chunks_size[2] + 0x80) != 0) &&
       ((info.interlace_method == 2 || (info.interlace_method == 6)))) {
      addChunk_PLTE((ucvector *)&data,(LodePNGColorMode *)&info.interlace_method);
    }
    if ((info.interlace_method == 3) &&
       (uVar2 = getPaletteTranslucency((uchar *)info.color._0_8_,(size_t)info.color.palette),
       uVar2 != 0)) {
      addChunk_tRNS((ucvector *)&data,(LodePNGColorMode *)&info.interlace_method);
    }
    if (((info.interlace_method == 0) || (info.interlace_method == 2)) &&
       ((int)info.color.palettesize != 0)) {
      addChunk_tRNS((ucvector *)&data,(LodePNGColorMode *)&info.interlace_method);
    }
    if (info.color.key_g != 0) {
      addChunk_bKGD((ucvector *)&data,(LodePNGInfo *)&outv.allocsize);
    }
    if (info.time.minute != 0) {
      addChunk_pHYs((ucvector *)&data,(LodePNGInfo *)&outv.allocsize);
    }
    if (info.unknown_chunks_data[0] != (uchar *)0x0) {
      uVar2 = addUnknownChunks((ucvector *)&data,info.unknown_chunks_data[0],
                               info.unknown_chunks_size[0]);
      *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
      if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) goto LAB_002895f0;
    }
    uVar2 = addChunk_IDAT((ucvector *)&data,(uchar *)datasize,(size_t)converted,
                          (LodePNGCompressSettings *)(info.unknown_chunks_size[2] + 0x38));
    *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
    if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) == 0) {
      if ((int)info.itext_strings != 0) {
        addChunk_tIME((ucvector *)&data,(LodePNGTime *)((long)&info.itext_strings + 4));
      }
      for (ppcStack_160 = (char **)0x0; ppcStack_160 != (char **)info._64_8_;
          ppcStack_160 = (char **)((long)ppcStack_160 + 1)) {
        sVar4 = strlen(*(char **)(info.text_num + (long)ppcStack_160 * 8));
        if (0x4f < sVar4) {
          *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x42;
          break;
        }
        sVar4 = strlen(*(char **)(info.text_num + (long)ppcStack_160 * 8));
        if (sVar4 == 0) {
          *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x43;
          break;
        }
        if (*(int *)(info.unknown_chunks_size[2] + 0x88) == 0) {
          addChunk_tEXt((ucvector *)&data,*(char **)(info.text_num + (long)ppcStack_160 * 8),
                        info.text_keys[(long)ppcStack_160]);
        }
        else {
          addChunk_zTXt((ucvector *)&data,*(char **)(info.text_num + (long)ppcStack_160 * 8),
                        info.text_keys[(long)ppcStack_160],
                        (LodePNGCompressSettings *)(info.unknown_chunks_size[2] + 0x38));
        }
      }
      if (*(int *)(info.unknown_chunks_size[2] + 0x84) != 0) {
        bVar1 = false;
        for (ppcStack_160 = (char **)0x0; ppcStack_160 != (char **)info._64_8_;
            ppcStack_160 = (char **)((long)ppcStack_160 + 1)) {
          iVar3 = strcmp(*(char **)(info.text_num + (long)ppcStack_160 * 8),"LodePNG");
          if (iVar3 == 0) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          addChunk_tEXt((ucvector *)&data,"LodePNG",LODEPNG_VERSION_STRING);
        }
      }
      for (ppcStack_160 = (char **)0x0; ppcStack_160 != info.text_strings;
          ppcStack_160 = (char **)((long)ppcStack_160 + 1)) {
        sVar4 = strlen(*(char **)(info.itext_num + (long)ppcStack_160 * 8));
        if (0x4f < sVar4) {
          *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x42;
          break;
        }
        sVar4 = strlen(*(char **)(info.itext_num + (long)ppcStack_160 * 8));
        if (sVar4 == 0) {
          *(undefined4 *)(info.unknown_chunks_size[2] + 0x1a0) = 0x43;
          break;
        }
        addChunk_iTXt((ucvector *)&data,*(uint *)(info.unknown_chunks_size[2] + 0x88),
                      *(char **)(info.itext_num + (long)ppcStack_160 * 8),
                      info.itext_keys[(long)ppcStack_160],info.itext_langtags[(long)ppcStack_160],
                      info.itext_transkeys[(long)ppcStack_160],
                      (LodePNGCompressSettings *)(info.unknown_chunks_size[2] + 0x38));
      }
      if (info.unknown_chunks_data[1] != (uchar *)0x0) {
        uVar2 = addUnknownChunks((ucvector *)&data,info.unknown_chunks_data[1],
                                 info.unknown_chunks_size[1]);
        *(uint *)(info.unknown_chunks_size[2] + 0x1a0) = uVar2;
        if (*(int *)(info.unknown_chunks_size[2] + 0x1a0) != 0) goto LAB_002895f0;
      }
      addChunk_IEND((ucvector *)&data);
    }
  }
LAB_002895f0:
  lodepng_info_cleanup((LodePNGInfo *)&outv.allocsize);
  lodepng_free((void *)datasize);
  *out = data;
  *outsize = (size_t)outv.data;
  return *(uint *)(info.unknown_chunks_size[2] + 0x1a0);
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}